

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad.h
# Opt level: O3

Fad<double> * __thiscall
Fad<double>::operator=
          (Fad<double> *this,
          FadExpr<FadBinaryMul<FadExpr<FadFuncSin<Fad<double>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>
          *fadexpr)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  double *pdVar4;
  FadExpr<FadFuncSin<Fad<double>_>_> *pFVar5;
  ulong uVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  value_type vVar11;
  double dVar12;
  double dVar13;
  
  pFVar5 = (fadexpr->fadexpr_).left_;
  uVar3 = (pFVar5->fadexpr_).expr_.dx_.num_elts;
  uVar1 = (((fadexpr->fadexpr_).right_)->fadexpr_).expr_.dx_.num_elts;
  if ((int)uVar1 < (int)uVar3) {
    uVar1 = uVar3;
  }
  uVar2 = (this->dx_).num_elts;
  if (uVar1 == uVar2) {
    if (uVar1 == 0) goto LAB_01427e3f;
    pdVar4 = (this->dx_).ptr_to_data;
  }
  else {
    if (uVar1 == 0) {
      if (uVar2 != 0) {
        pdVar4 = (this->dx_).ptr_to_data;
        if (pdVar4 != (double *)0x0) {
          operator_delete__(pdVar4);
        }
        (this->dx_).num_elts = 0;
        (this->dx_).ptr_to_data = (double *)0x0;
      }
      goto LAB_01427e3f;
    }
    if (uVar2 != 0) {
      pdVar4 = (this->dx_).ptr_to_data;
      if (pdVar4 != (double *)0x0) {
        operator_delete__(pdVar4);
        pFVar5 = (fadexpr->fadexpr_).left_;
      }
      (this->dx_).ptr_to_data = (double *)0x0;
    }
    (this->dx_).num_elts = uVar1;
    uVar6 = 0xffffffffffffffff;
    if (-1 < (int)uVar1) {
      uVar6 = (ulong)uVar1 << 3;
    }
    pdVar4 = (double *)operator_new__(uVar6);
    (this->dx_).ptr_to_data = pdVar4;
    uVar3 = (pFVar5->fadexpr_).expr_.dx_.num_elts;
  }
  if ((uVar3 == 0) || ((((fadexpr->fadexpr_).right_)->fadexpr_).expr_.dx_.num_elts == 0)) {
    if (0 < (int)uVar1) {
      uVar6 = 0;
      do {
        vVar11 = FadBinaryMul<FadExpr<FadFuncSin<Fad<double>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>
                 ::dx(&fadexpr->fadexpr_,(int)uVar6);
        pdVar4[uVar6] = vVar11;
        uVar6 = uVar6 + 1;
      } while (uVar1 != uVar6);
    }
  }
  else if (0 < (int)uVar1) {
    uVar6 = 0;
    do {
      pFVar5 = (fadexpr->fadexpr_).left_;
      dVar12 = (pFVar5->fadexpr_).expr_.dx_.ptr_to_data[uVar6];
      dVar7 = cos((pFVar5->fadexpr_).expr_.val_);
      dVar8 = sin((((fadexpr->fadexpr_).right_)->fadexpr_).expr_.val_);
      pFVar5 = (fadexpr->fadexpr_).right_;
      dVar13 = (pFVar5->fadexpr_).expr_.dx_.ptr_to_data[uVar6];
      dVar9 = cos((pFVar5->fadexpr_).expr_.val_);
      dVar10 = sin((((fadexpr->fadexpr_).left_)->fadexpr_).expr_.val_);
      pdVar4[uVar6] = dVar8 * dVar7 * dVar12 + dVar10 * dVar9 * dVar13;
      uVar6 = uVar6 + 1;
    } while (uVar1 != uVar6);
  }
LAB_01427e3f:
  dVar12 = sin((((fadexpr->fadexpr_).left_)->fadexpr_).expr_.val_);
  dVar13 = sin((((fadexpr->fadexpr_).right_)->fadexpr_).expr_.val_);
  this->val_ = dVar13 * dVar12;
  return this;
}

Assistant:

inline Fad<T> & Fad<T>::operator=(const FadExpr<ExprT>& fadexpr) 
{
  int sz = fadexpr.size();

  if ( sz != dx_.size() ) dx_.resize(sz);

  if ( sz ) {
    T* RESTRICT dxp = dx_.begin();
    if (fadexpr.hasFastAccess())
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.fastAccessDx(i);
    else
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.dx(i);
  }
  
  val_ = fadexpr.val();
  
  return *this;
}